

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

void ImGui::TabBarAddTab(ImGuiTabBar *tab_bar,ImGuiTabItemFlags tab_flags,ImGuiWindow *window)

{
  ImGuiContext *pIVar1;
  ImGuiTabItem *pIVar2;
  ImGuiTabItem local_50;
  
  pIVar1 = GImGui;
  pIVar2 = TabBarFindTabByID(tab_bar,window->ID);
  if (pIVar2 != (ImGuiTabItem *)0x0) {
    __assert_fail("TabBarFindTabByID(tab_bar, window->ID) == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                  ,0x1da5,
                  "void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)");
  }
  if (pIVar1->CurrentTabBar != tab_bar) {
    local_50.Flags = tab_flags | 0x100000;
    if (window->HasCloseButton != false) {
      local_50.Flags = tab_flags;
    }
    local_50.WantClose = false;
    local_50._45_3_ = 0;
    local_50.Offset = 0.0;
    local_50.Width = 0.0;
    local_50.ContentWidth = 0.0;
    local_50.LastFrameSelected = -1;
    local_50.NameOffset = -1;
    local_50.BeginOrder = -1;
    local_50.IndexDuringLayout = -1;
    local_50.ID = window->ID;
    local_50.LastFrameVisible = tab_bar->CurrFrameVisible;
    if (local_50.LastFrameVisible == -1) {
      local_50.LastFrameVisible = pIVar1->FrameCount + -1;
    }
    local_50.Window = window;
    ImVector<ImGuiTabItem>::push_back(&tab_bar->Tabs,&local_50);
    return;
  }
  __assert_fail("g.CurrentTabBar != tab_bar",
                "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui_widgets.cpp"
                ,0x1da6,"void ImGui::TabBarAddTab(ImGuiTabBar *, ImGuiTabItemFlags, ImGuiWindow *)")
  ;
}

Assistant:

void ImGui::TabBarAddTab(ImGuiTabBar* tab_bar, ImGuiTabItemFlags tab_flags, ImGuiWindow* window)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(TabBarFindTabByID(tab_bar, window->ID) == NULL);
    IM_ASSERT(g.CurrentTabBar != tab_bar);  // Can't work while the tab bar is active as our tab doesn't have an X offset yet, in theory we could/should test something like (tab_bar->CurrFrameVisible < g.FrameCount) but we'd need to solve why triggers the commented early-out assert in BeginTabBarEx() (probably dock node going from implicit to explicit in same frame)

    if (!window->HasCloseButton)
        tab_flags |= ImGuiTabItemFlags_NoCloseButton;       // Set _NoCloseButton immediately because it will be used for first-frame width calculation.

    ImGuiTabItem new_tab;
    new_tab.ID = window->ID;
    new_tab.Flags = tab_flags;
    new_tab.LastFrameVisible = tab_bar->CurrFrameVisible;   // Required so BeginTabBar() doesn't ditch the tab
    if (new_tab.LastFrameVisible == -1)
        new_tab.LastFrameVisible = g.FrameCount - 1;
    new_tab.Window = window;                                // Required so tab bar layout can compute the tab width before tab submission
    tab_bar->Tabs.push_back(new_tab);
}